

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O3

void project_monster_hurt_only
               (project_monster_handler_context_t *context,wchar_t flag,mon_messages hurt_msg,
               mon_messages die_msg)

{
  _Bool _Var1;
  long lVar2;
  
  if (context->seen == true) {
    flag_on_dbg(context->lore->flags,0xc,flag,"context->lore->flags","flag");
  }
  _Var1 = flag_has_dbg(context->mon->race->flags,0xc,flag,"context->mon->race->flags","flag");
  if (_Var1) {
    context->hurt_msg = hurt_msg;
    lVar2 = 0x4c;
  }
  else {
    die_msg = MON_MSG_NONE;
    lVar2 = 0x1c;
  }
  *(mon_messages *)((long)context->mon_timed + lVar2 + -0x50) = die_msg;
  return;
}

Assistant:

static void project_monster_hurt_only(project_monster_handler_context_t *context, int flag, enum mon_messages hurt_msg, enum mon_messages die_msg)
{
	if (context->seen) rf_on(context->lore->flags, flag);

	if (rf_has(context->mon->race->flags, flag)) {
		context->hurt_msg = hurt_msg;
		context->die_msg = die_msg;
	}
	else {
		context->dam = 0;
	}
}